

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O2

void freeTransportHandleData(MQTTTRANSPORT_HANDLE_DATA *transport_data)

{
  if (transport_data->mqttClient != (MQTT_CLIENT_HANDLE)0x0) {
    mqtt_client_deinit(transport_data->mqttClient);
    transport_data->mqttClient = (MQTT_CLIENT_HANDLE)0x0;
  }
  if (transport_data->retry_control_handle != (RETRY_CONTROL_HANDLE)0x0) {
    retry_control_destroy(transport_data->retry_control_handle);
  }
  setSavedTlsOptions(transport_data,(OPTIONHANDLER_HANDLE)0x0);
  tickcounter_destroy(transport_data->msgTickCounter);
  freeProxyData(transport_data);
  STRING_delete(transport_data->devicesAndModulesPath);
  STRING_delete(transport_data->topic_MqttEvent);
  STRING_delete(transport_data->topic_MqttMessage);
  STRING_delete(transport_data->device_id);
  STRING_delete(transport_data->module_id);
  STRING_delete(transport_data->hostAddress);
  STRING_delete(transport_data->configPassedThroughUsername);
  STRING_delete(transport_data->topic_GetState);
  STRING_delete(transport_data->topic_NotifyState);
  STRING_delete(transport_data->topic_DeviceMethods);
  STRING_delete(transport_data->topic_InputQueue);
  DestroyXioTransport(transport_data);
  free(transport_data);
  return;
}

Assistant:

static void freeTransportHandleData(MQTTTRANSPORT_HANDLE_DATA* transport_data)
{
    if (transport_data->mqttClient != NULL)
    {
        mqtt_client_deinit(transport_data->mqttClient);
        transport_data->mqttClient = NULL;
    }

    if (transport_data->retry_control_handle != NULL)
    {
        retry_control_destroy(transport_data->retry_control_handle);
    }

    setSavedTlsOptions(transport_data, NULL);

    tickcounter_destroy(transport_data->msgTickCounter);

    freeProxyData(transport_data);

    STRING_delete(transport_data->devicesAndModulesPath);
    STRING_delete(transport_data->topic_MqttEvent);
    STRING_delete(transport_data->topic_MqttMessage);
    STRING_delete(transport_data->device_id);
    STRING_delete(transport_data->module_id);
    STRING_delete(transport_data->hostAddress);
    STRING_delete(transport_data->configPassedThroughUsername);
    STRING_delete(transport_data->topic_GetState);
    STRING_delete(transport_data->topic_NotifyState);
    STRING_delete(transport_data->topic_DeviceMethods);
    STRING_delete(transport_data->topic_InputQueue);

    DestroyXioTransport(transport_data);

    free(transport_data);
}